

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_solver.cpp
# Opt level: O2

void test_3(string *out_dir)

{
  ChStreamOutAscii *pCVar1;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> mvarsb;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> mvarsa;
  ChMatrixDynamic<> mtempA;
  ChSystemDescriptor mdescriptor;
  ChKblockGeneric mKb;
  ChKblockGeneric mKa;
  _Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_680;
  ChMatrixDynamic<> mtempB;
  _Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_650;
  ChVectorDynamic<double> mx;
  ChSolverMINRES solver;
  ChMatrix33<double> minertia;
  ChVariablesBodyOwnMass mvarB;
  ChVariablesBodyOwnMass mvarA;
  ChConstraintTwoBodies mca;
  ChConstraintTwoBodies mcb;
  ChVariablesBodyOwnMass mvarC;
  
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar1,"\n-------------------------------------------------\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"TEST: generic system with stiffness blocks \n\n");
  chrono::ChSystemDescriptor::ChSystemDescriptor(&mdescriptor);
  chrono::ChMatrix33<double>::ChMatrix33(&minertia,6.0);
  chrono::ChVariablesBodyOwnMass::ChVariablesBodyOwnMass(&mvarA);
  chrono::ChVariablesBodyOwnMass::SetBodyMass(5.0);
  chrono::ChVariablesBodyOwnMass::SetBodyInertia((ChMatrix33 *)&mvarA);
  chrono::ChVariables::Get_fb((ChVectorRef *)&mca,(ChVariables *)&mvarA);
  Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
  ::fillRandom((MatrixBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                *)&mca,-3.0,5.0);
  chrono::ChVariablesBodyOwnMass::ChVariablesBodyOwnMass(&mvarB);
  chrono::ChVariablesBodyOwnMass::SetBodyMass(4.0);
  chrono::ChVariablesBodyOwnMass::SetBodyInertia((ChMatrix33 *)&mvarB);
  chrono::ChVariables::Get_fb((ChVectorRef *)&mca,(ChVariables *)&mvarB);
  Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
  ::fillRandom((MatrixBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                *)&mca,1.0,3.0);
  chrono::ChVariablesBodyOwnMass::ChVariablesBodyOwnMass(&mvarC);
  chrono::ChVariablesBodyOwnMass::SetBodyMass(5.5);
  chrono::ChVariablesBodyOwnMass::SetBodyInertia((ChMatrix33 *)&mvarC);
  chrono::ChVariables::Get_fb((ChVectorRef *)&mca,(ChVariables *)&mvarC);
  Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
  ::fillRandom((MatrixBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                *)&mca,-8.0,3.0);
  chrono::ChSystemDescriptor::InsertVariables(&mdescriptor,(ChVariables *)&mvarA);
  chrono::ChSystemDescriptor::InsertVariables(&mdescriptor,(ChVariables *)&mvarB);
  chrono::ChSystemDescriptor::InsertVariables(&mdescriptor,(ChVariables *)&mvarC);
  chrono::ChConstraintTwoBodies::ChConstraintTwoBodies
            (&mca,(ChVariablesBody *)&mvarA,(ChVariablesBody *)&mvarB);
  chrono::ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)&mcb,&mca);
  Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>_>
  ::fillRandom((MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                *)&mcb,-1.0,1.0);
  chrono::ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)&mcb,&mca);
  Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>_>
  ::fillRandom((MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                *)&mcb,-1.0,1.0);
  chrono::ChConstraintTwoBodies::ChConstraintTwoBodies
            (&mcb,(ChVariablesBody *)&mvarA,(ChVariablesBody *)&mvarB);
  chrono::ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)&solver,&mcb);
  Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>_>
  ::fillRandom((MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                *)&solver,-1.0,1.0);
  chrono::ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)&solver,&mcb);
  Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>_>
  ::fillRandom((MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                *)&solver,-1.0,1.0);
  chrono::ChSystemDescriptor::InsertConstraint(&mdescriptor,(ChConstraint *)&mca);
  chrono::ChSystemDescriptor::InsertConstraint(&mdescriptor,(ChConstraint *)&mcb);
  mvarsa.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _mKa = __cxa_finalize;
  mvarsa.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT416(0) << 0x40;
  _solver = (ChVariables *)&mvarA;
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&mvarsa,
             (ChVariables **)&solver);
  _solver = (ChVariables *)&mvarB;
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&mvarsa,
             (ChVariables **)&solver);
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
            ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_650,
             &mvarsa);
  chrono::ChKblockGeneric::SetVariables(&mKa,&local_650);
  std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
            (&local_650);
  chrono::ChKblockGeneric::Get_K((ChMatrixRef *)&solver,&mKa);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
  PlainObjectBase<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&mtempA,
             (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              *)&solver);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::fillRandom
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&mtempA,-0.3,0.3);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_1> *)&mtempB,
             (DenseStorage<double,__1,__1,__1,_1> *)&mtempA);
  mx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)&mtempA;
  Eigen::
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>
  ::Product((Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
             *)&mKb,(Lhs *)&mx,&mtempB);
  chrono::ChKblockGeneric::Get_K((ChMatrixRef *)&solver,&mKa);
  Eigen::internal::
  call_assignment<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
            ((Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)&solver,
             (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
              *)&mKb);
  chrono::ChSystemDescriptor::InsertKblock(&mdescriptor,(ChKblock *)&mKa);
  mvarsb.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _mKb = __cxa_finalize;
  mvarsb.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT416(0) << 0x40;
  _solver = (ChVariables *)&mvarB;
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&mvarsb,
             (ChVariables **)&solver);
  _solver = (ChVariables *)&mvarC;
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&mvarsb,
             (ChVariables **)&solver);
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
            ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_680,
             &mvarsb);
  chrono::ChKblockGeneric::SetVariables(&mKb,&local_680);
  std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
            (&local_680);
  chrono::ChKblockGeneric::Get_K((ChMatrixRef *)&solver,&mKa);
  chrono::ChKblockGeneric::Get_K((ChMatrixRef *)&mx,&mKb);
  Eigen::internal::
  call_assignment<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>>
            ((Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)&mx,
             (Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)&solver);
  chrono::ChSystemDescriptor::InsertKblock(&mdescriptor,(ChKblock *)&mKb);
  (**(code **)(_mdescriptor + 0x48))();
  chrono::ChSolverMINRES::ChSolverMINRES(&solver);
  chrono::ChIterativeSolverLS::Setup((ChSystemDescriptor *)&solver);
  chrono::ChIterativeSolverLS::Solve((ChSystemDescriptor *)&solver);
  mx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0
  ;
  mx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  chrono::ChSystemDescriptor::FromUnknownsToVector((Matrix *)&mdescriptor,SUB81(&mx,0));
  Eigen::internal::handmade_aligned_free
            (mx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  chrono::ChSolverMINRES::~ChSolverMINRES(&solver);
  std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
            (&mvarsb.
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>);
  chrono::ChKblockGeneric::~ChKblockGeneric(&mKb);
  Eigen::internal::handmade_aligned_free
            (mtempB.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
             m_data);
  Eigen::internal::handmade_aligned_free
            (mtempA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
             m_data);
  std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
            (&mvarsa.
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>);
  chrono::ChKblockGeneric::~ChKblockGeneric(&mKa);
  chrono::ChVariables::~ChVariables((ChVariables *)&mvarC);
  chrono::ChVariables::~ChVariables((ChVariables *)&mvarB);
  chrono::ChVariables::~ChVariables((ChVariables *)&mvarA);
  chrono::ChSystemDescriptor::~ChSystemDescriptor(&mdescriptor);
  return;
}

Assistant:

void test_3(const std::string& out_dir) {
    GetLog() << "\n-------------------------------------------------\n";
    GetLog() << "TEST: generic system with stiffness blocks \n\n";

    // Important: create a 'system descriptor' object that
    // contains variables and constraints:

    ChSystemDescriptor mdescriptor;

    // Now let's add variables, constraints and stiffness, as sparse data:

    mdescriptor.BeginInsertion();  // ----- system description

    // Create C++ objects representing 'variables', set their M blocks
    // (the masses) and set their known terms 'fb'

    ChMatrix33<> minertia(6);

    ChVariablesBodyOwnMass mvarA;
    mvarA.SetBodyMass(5);
    mvarA.SetBodyInertia(minertia);
    mvarA.Get_fb().fillRandom(-3, 5);

    ChVariablesBodyOwnMass mvarB;
    mvarB.SetBodyMass(4);
    mvarB.SetBodyInertia(minertia);
    mvarB.Get_fb().fillRandom(1, 3);

    ChVariablesBodyOwnMass mvarC;
    mvarC.SetBodyMass(5.5);
    mvarC.SetBodyInertia(minertia);
    mvarC.Get_fb().fillRandom(-8, 3);

    ////ChMatrixDynamic<> foo(3, 4);
    ////foo.fillRandom(0, 10);
    ////std::cout << "foo....\n" << foo << std::endl;
    ////return;

    mdescriptor.InsertVariables(&mvarA);
    mdescriptor.InsertVariables(&mvarB);
    mdescriptor.InsertVariables(&mvarC);

    // Create two C++ objects representing 'constraints' between variables
    // and set the jacobian to random values;
    // Also set cfm term (E diagonal = -cfm)

    ChConstraintTwoBodies mca(&mvarA, &mvarB);
    mca.Set_b_i(3);
    mca.Get_Cq_a().fillRandom(-1, 1);
    mca.Get_Cq_b().fillRandom(-1, 1);
    mca.Set_cfm_i(0.2);

    ChConstraintTwoBodies mcb(&mvarA, &mvarB);
    mcb.Set_b_i(5);
    mcb.Get_Cq_a().fillRandom(-1, 1);
    mcb.Get_Cq_b().fillRandom(-1, 1);
    mcb.Set_cfm_i(0.1);

    mdescriptor.InsertConstraint(&mca);
    mdescriptor.InsertConstraint(&mcb);

    // Create two C++ objects representing 'stiffness' between variables:

    ChKblockGeneric mKa;
    // set the affected variables (so this K is a 12x12 matrix, relative to 4 6x6 blocks)
    std::vector<ChVariables*> mvarsa;
    mvarsa.push_back(&mvarA);
    mvarsa.push_back(&mvarB);
    mKa.SetVariables(mvarsa);

    // just fill K with random values (but symmetric, by making a product of matr*matrtransposed)
    ChMatrixDynamic<> mtempA = mKa.Get_K();
    mtempA.fillRandom(-0.3, 0.3);
    ChMatrixDynamic<> mtempB(mtempA);
    mKa.Get_K() = -mtempA * mtempB;

    mdescriptor.InsertKblock(&mKa);

    ChKblockGeneric mKb;
    // set the affected variables (so this K is a 12x12 matrix, relative to 4 6x6 blocks)
    std::vector<ChVariables*> mvarsb;
    mvarsb.push_back(&mvarB);
    mvarsb.push_back(&mvarC);
    mKb.SetVariables(mvarsb);

    mKb.Get_K() = mKa.Get_K();

    mdescriptor.InsertKblock(&mKb);

    mdescriptor.EndInsertion();  // ----- system description ends here

    // Create the solver (MINRES) ...
    ChSolverMINRES solver;
    solver.SetMaxIterations(100);
    solver.SetTolerance(1e-12);
    solver.EnableDiagonalPreconditioner(true);
    solver.SetVerbose(true);

    // .. solve the system (passing variables, constraints, stiffness
    //    blocks with the ChSystemDescriptor that we populated above)
    solver.Setup(mdescriptor);
    solver.Solve(mdescriptor);

    // .. optional: get the result as a single vector (it collects all q_i and l_i
    //    solved values stored in variables and constraints), just for check.
    chrono::ChVectorDynamic<double> mx;
    mdescriptor.FromUnknownsToVector(mx);  // x ={q,-l}

    /*
    // Alternatively, instead of using FromUnknownsToVector, to fetch
    // result, you could just loop over the variables (q values) and
    // over the constraints (l values), as already shown in previous examples:

    for (int im = 0; im < mdescriptor.GetVariablesList().size(); im++)
        GetLog() << "   " << mdescriptor.GetVariablesList()[im]->Get_qb()(0) << "\n";

    for (int ic = 0; ic < mdescriptor.GetConstraintsList().size(); ic++)
        GetLog() << "   " << mdescriptor.GetConstraintsList()[ic]->Get_l_i() << "\n";
    */
}